

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanocat.c
# Opt level: O2

void nn_resp_loop(nn_options_t *options,int sock)

{
  uint uVar1;
  void *in_RAX;
  int *piVar2;
  void *buf;
  
  buf = in_RAX;
LAB_00103c94:
  uVar1 = nn_recv(sock,&buf,0xffffffffffffffff,0);
  if ((int)uVar1 < 0) goto code_r0x00103caa;
  goto LAB_00103cb4;
code_r0x00103caa:
  piVar2 = __errno_location();
  if (*piVar2 != 0xb) {
LAB_00103cb4:
    nn_assert_errno(~uVar1 >> 0x1f,"Can\'t recv");
    nn_print_message(options,(char *)buf,uVar1);
    nn_freemsg(buf);
    uVar1 = nn_send(sock,(options->data_to_send).data,(options->data_to_send).length);
    if ((int)uVar1 < 0) {
      piVar2 = __errno_location();
      if (*piVar2 == 0xb) {
        fwrite("Message not sent (EAGAIN)\n",0x1a,1,_stderr);
        goto LAB_00103c94;
      }
    }
    nn_assert_errno(~uVar1 >> 0x1f,"Can\'t send");
  }
  goto LAB_00103c94;
}

Assistant:

void nn_resp_loop (nn_options_t *options, int sock)
{
    int rc;
    void *buf;

    for (;;) {
        rc = nn_recv (sock, &buf, NN_MSG, 0);
        if (rc < 0 && errno == EAGAIN) {
                continue;
        } else {
            nn_assert_errno (rc >= 0, "Can't recv");
        }
        nn_print_message (options, buf, rc);
        nn_freemsg (buf);
        rc = nn_send (sock,
            options->data_to_send.data, options->data_to_send.length,
            0);
        if (rc < 0 && errno == EAGAIN) {
            fprintf (stderr, "Message not sent (EAGAIN)\n");
        } else {
            nn_assert_errno (rc >= 0, "Can't send");
        }
    }
}